

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O0

string * __thiscall
cmakels::cmake_query::cmake_query::evaluate_variable
          (string *__return_storage_ptr__,cmake_query *this,string *name,string *uri)

{
  char *__s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_reference __rhs;
  allocator<char> local_4d [19];
  byte local_3a;
  allocator<char> local_39;
  char *local_38;
  char *var;
  cmMakefile *mf;
  string *uri_local;
  string *name_local;
  cmake_query *this_local;
  
  mf = (cmMakefile *)uri;
  uri_local = name;
  name_local = (string *)this;
  this_local = (cmake_query *)__return_storage_ptr__;
  var = (char *)get_makefile(this,uri);
  if ((cmMakefile *)var == (cmMakefile *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"<variable-not-found>",local_4d);
    std::allocator<char>::~allocator(local_4d);
  }
  else {
    __s = cmMakefile::GetDefinition((cmMakefile *)var,uri_local);
    local_3a = 0;
    local_38 = __s;
    if (__s == (char *)0x0) {
      this_00 = cmMakefile::GetListFiles_abi_cxx11_((cmMakefile *)var);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](this_00,0);
      std::operator+(__return_storage_ptr__,"tried file",__rhs);
    }
    else {
      std::allocator<char>::allocator();
      local_3a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_39);
    }
    if ((local_3a & 1) != 0) {
      std::allocator<char>::~allocator(&local_39);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmake_query::evaluate_variable(std::string const &name,
                                           std::string const &uri) {
  auto mf = get_makefile(uri);
  if (mf) {
    auto var = mf->GetDefinition(name);
    return var ? var : "tried file" + mf->GetListFiles()[0];
  }
  return "<variable-not-found>";
}